

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_callermsg(lua_State *L,char *msg)

{
  TValue *pTVar1;
  TValue *pTVar2;
  cTValue *local_28;
  TValue *pframe;
  TValue *frame;
  char *msg_local;
  lua_State *L_local;
  
  pframe = (TValue *)0x0;
  local_28 = (cTValue *)0x0;
  if (*(long *)((L->glref).ptr64 + 0x178) == 0) {
    pTVar1 = L->base;
    pTVar2 = pTVar1 + -1;
    pframe = pTVar2;
    if ((pTVar2->u64 & 3) == 0) {
      local_28 = pTVar2 + -(ulong)((*(uint *)(pTVar2->u64 - 4) >> 8 & 0xff) + 2);
    }
    else if ((pTVar2->u64 & 7) == 2) {
      if (pTVar1[-4].u64 == 1) {
        pframe = (TValue *)0x0;
        local_28 = pTVar2;
      }
      else {
        local_28 = (cTValue *)((long)pTVar2 - (pTVar2->u64 & 0xfffffffffffffff8));
        if ((0xb6 < *(byte *)((pTVar1[-2].u64 & 0x7fffffffffff) + 10)) &&
           (*(byte *)((pTVar1[-2].u64 & 0x7fffffffffff) + 10) < 199)) {
          L->base = local_28 + 1;
          L->top = pTVar2;
          *(TValue *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x18) = pTVar1[-3];
        }
      }
    }
  }
  lj_debug_addloc(L,msg,local_28,pframe);
  lj_err_run(L);
}

Assistant:

LJ_NOINLINE void lj_err_callermsg(lua_State *L, const char *msg)
{
  TValue *frame = NULL, *pframe = NULL;
  if (!(LJ_HASJIT && tvref(G(L)->jit_base))) {
    frame = L->base-1;
    if (frame_islua(frame)) {
      pframe = frame_prevl(frame);
    } else if (frame_iscont(frame)) {
      if (frame_iscont_fficb(frame)) {
	pframe = frame;
	frame = NULL;
      } else {
	pframe = frame_prevd(frame);
#if LJ_HASFFI
	/* Remove frame for FFI metamethods. */
	if (frame_func(frame)->c.ffid >= FF_ffi_meta___index &&
	    frame_func(frame)->c.ffid <= FF_ffi_meta___tostring) {
	  L->base = pframe+1;
	  L->top = frame;
	  setcframe_pc(cframe_raw(L->cframe), frame_contpc(frame));
	}
#endif
      }
    }
  }
  lj_debug_addloc(L, msg, pframe, frame);
  lj_err_run(L);
}